

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::ValidationErrorCollector::AddWarning
          (ValidationErrorCollector *this,string *filename,string *element_name,Message *descriptor,
          ErrorLocation location,string *message)

{
  MultiFileErrorCollector *pMVar1;
  SourceLocationTable *this_00;
  int column;
  int line;
  uint local_20;
  uint local_1c;
  
  if (this->owner_->error_collector_ != (MultiFileErrorCollector *)0x0) {
    this_00 = &this->owner_->source_locations_;
    if (location == IMPORT) {
      SourceLocationTable::FindImport
                (this_00,descriptor,element_name,(int *)&local_1c,(int *)&local_20);
    }
    else {
      SourceLocationTable::Find(this_00,descriptor,location,(int *)&local_1c,(int *)&local_20);
    }
    pMVar1 = this->owner_->error_collector_;
    (*pMVar1->_vptr_MultiFileErrorCollector[3])
              (pMVar1,filename,(ulong)local_1c,(ulong)local_20,message);
  }
  return;
}

Assistant:

void SourceTreeDescriptorDatabase::ValidationErrorCollector::AddWarning(
    const std::string& filename, const std::string& element_name,
    const Message* descriptor, ErrorLocation location,
    const std::string& message) {
  if (owner_->error_collector_ == NULL) return;

  int line, column;
  if (location == DescriptorPool::ErrorCollector::IMPORT) {
    owner_->source_locations_.FindImport(descriptor, element_name, &line,
                                         &column);
  } else {
    owner_->source_locations_.Find(descriptor, location, &line, &column);
  }
  owner_->error_collector_->AddWarning(filename, line, column, message);
}